

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O2

void report(long time,int count)

{
  ostream *poVar1;
  
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::operator<<(poVar1,"    num: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,count);
  std::operator<<(poVar1,", seconds: ");
  poVar1 = std::ostream::_M_insert<double>((double)time / 1000.0);
  std::operator<<(poVar1,", num_per_second: ");
  poVar1 = std::ostream::_M_insert<double>((double)count / ((double)time / 1000.0));
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void report( long time, int count )
{
  double seconds = ( double ) time / 1000;
  double num_per_second = count / seconds;
  std::cout << std::endl << "    num: " << count
  << ", seconds: " << seconds
  << ", num_per_second: " << num_per_second << std::endl;
}